

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O2

void MARGINAL::compute_expert_loss<true>(data *sm,example *ec)

{
  float fVar1;
  vw *pvVar2;
  loss_function *plVar3;
  float extraout_XMM0_Da;
  float fVar4;
  float fVar5;
  float fVar6;
  
  pvVar2 = sm->all;
  fVar1 = (ec->l).simple.label;
  fVar5 = sm->net_feature_weight;
  if (sm->net_weight + fVar5 <= 0.0) {
    sm->net_feature_weight = 1.0;
    fVar4 = sm->feature_pred;
    fVar5 = 1.0;
  }
  else {
    fVar4 = sm->feature_pred * fVar5 + sm->average_pred;
  }
  fVar6 = 1.0 / (sm->net_weight + fVar5);
  fVar4 = fVar4 * fVar6;
  sm->average_pred = fVar4;
  (ec->pred).scalar = fVar4;
  ec->partial_prediction = sm->average_pred;
  fVar5 = sm->net_feature_weight;
  plVar3 = pvVar2->loss;
  (*plVar3->_vptr_loss_function[1])(sm->feature_pred,fVar1,plVar3,pvVar2->sd);
  sm->alg_loss = (extraout_XMM0_Da * fVar5 + sm->alg_loss) * fVar6;
  return;
}

Assistant:

void compute_expert_loss(data& sm, example& ec)
{
  vw& all = *sm.all;
  // add in the feature-based expert and normalize,
  float label = ec.l.simple.label;

  if (sm.net_weight + sm.net_feature_weight > 0.)
    sm.average_pred += sm.net_feature_weight * sm.feature_pred;
  else
  {
    sm.net_feature_weight = 1.;
    sm.average_pred = sm.feature_pred;
  }
  float inv_weight = 1.0f / (sm.net_weight + sm.net_feature_weight);
  sm.average_pred *= inv_weight;
  ec.pred.scalar = sm.average_pred;
  ec.partial_prediction = sm.average_pred;

  if (is_learn)
  {
    sm.alg_loss += sm.net_feature_weight * all.loss->getLoss(all.sd, sm.feature_pred, label);
    sm.alg_loss *= inv_weight;
  }
}